

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2_builder.cpp
# Opt level: O0

int32_t allocIndex2Block(UNewTrie2 *trie)

{
  int32_t newTop;
  int32_t newBlock;
  UNewTrie2 *trie_local;
  
  trie_local._4_4_ = trie->index2Length;
  if (trie_local._4_4_ + 0x40 < 0x8aa1) {
    trie->index2Length = trie_local._4_4_ + 0x40;
    memcpy(trie->index2 + trie_local._4_4_,trie->index2 + trie->index2NullOffset,0x100);
  }
  else {
    trie_local._4_4_ = -1;
  }
  return trie_local._4_4_;
}

Assistant:

static int32_t
allocIndex2Block(UNewTrie2 *trie) {
    int32_t newBlock, newTop;

    newBlock=trie->index2Length;
    newTop=newBlock+UTRIE2_INDEX_2_BLOCK_LENGTH;
    if(newTop>UPRV_LENGTHOF(trie->index2)) {
        /*
         * Should never occur.
         * Either UTRIE2_MAX_BUILD_TIME_INDEX_LENGTH is incorrect,
         * or the code writes more values than should be possible.
         */
        return -1;
    }
    trie->index2Length=newTop;
    uprv_memcpy(trie->index2+newBlock, trie->index2+trie->index2NullOffset, UTRIE2_INDEX_2_BLOCK_LENGTH*4);
    return newBlock;
}